

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-close-stdout-read-stdin.c
# Opt level: O3

int run_test_pipe_close_stdout_read_stdin(void)

{
  int iVar1;
  uint __pid;
  int extraout_EAX;
  ssize_t sVar2;
  uv_loop_t *puVar3;
  char buf;
  int fd [2];
  int status;
  undefined1 local_121;
  undefined1 local_120 [8];
  ushort local_118;
  
  puVar3 = (uv_loop_t *)local_120;
  iVar1 = pipe((int *)puVar3);
  if (iVar1 == 0) {
    __pid = fork();
    close(local_120._4_4_);
    puVar3 = (uv_loop_t *)(ulong)(uint)local_120._0_4_;
    if (__pid != 0) {
      close(local_120._0_4_);
      puVar3 = (uv_loop_t *)(ulong)__pid;
      waitpid(__pid,(int *)&stack0xfffffffffffffee8,0);
      if ((local_118 & 0xff7f) != 0) {
        run_test_pipe_close_stdout_read_stdin_cold_2();
        goto LAB_00162726;
      }
LAB_001627bb:
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00162801;
    }
LAB_00162726:
    sVar2 = read((int)puVar3,&local_121,1);
    if (2 < (int)sVar2 + 1U) goto LAB_00162806;
    close(0);
    puVar3 = (uv_loop_t *)(ulong)(uint)local_120._0_4_;
    iVar1 = dup(local_120._0_4_);
    if (iVar1 == -1) goto LAB_0016280b;
    puVar3 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar3,(uv_pipe_t *)&stack0xfffffffffffffee8,0);
    if (iVar1 != 0) goto LAB_00162810;
    puVar3 = (uv_loop_t *)&stack0xfffffffffffffee8;
    iVar1 = uv_pipe_open((uv_pipe_t *)puVar3,0);
    if (iVar1 != 0) goto LAB_00162815;
    puVar3 = (uv_loop_t *)&stack0xfffffffffffffee8;
    iVar1 = uv_read_start((uv_stream_t *)puVar3,alloc_buffer,read_stdin);
    if (iVar1 == 0) {
      puVar3 = uv_default_loop();
      iVar1 = uv_run(puVar3,UV_RUN_NOWAIT);
      if (iVar1 != 0) goto LAB_0016281f;
      goto LAB_001627bb;
    }
  }
  else {
    run_test_pipe_close_stdout_read_stdin_cold_1();
LAB_00162801:
    run_test_pipe_close_stdout_read_stdin_cold_8();
LAB_00162806:
    run_test_pipe_close_stdout_read_stdin_cold_3();
LAB_0016280b:
    run_test_pipe_close_stdout_read_stdin_cold_9();
LAB_00162810:
    run_test_pipe_close_stdout_read_stdin_cold_4();
LAB_00162815:
    run_test_pipe_close_stdout_read_stdin_cold_5();
  }
  run_test_pipe_close_stdout_read_stdin_cold_6();
LAB_0016281f:
  run_test_pipe_close_stdout_read_stdin_cold_7();
  iVar1 = uv_is_closing((uv_handle_t *)puVar3);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar3,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(pipe_close_stdout_read_stdin) {
  int r = -1;
  int pid;
  int fd[2];
  int status;
  char buf;
  uv_pipe_t stdin_pipe;

  r = pipe(fd);
  ASSERT(r == 0);

  if ((pid = fork()) == 0) {
    /*
     * Make the read side of the pipe our stdin.
     * The write side will be closed by the parent process.
    */
    close(fd[1]);
    /* block until write end of pipe is closed */
    r = read(fd[0], &buf, 1);
    ASSERT(-1 <= r && r <= 1);
    close(0);
    r = dup(fd[0]);
    ASSERT(r != -1);

    /* Create a stream that reads from the pipe. */
    r = uv_pipe_init(uv_default_loop(), (uv_pipe_t *)&stdin_pipe, 0);
    ASSERT(r == 0);

    r = uv_pipe_open((uv_pipe_t *)&stdin_pipe, 0);
    ASSERT(r == 0);

    r = uv_read_start((uv_stream_t *)&stdin_pipe, alloc_buffer, read_stdin);
    ASSERT(r == 0);

    /*
     * Because the other end of the pipe was closed, there should
     * be no event left to process after one run of the event loop.
     * Otherwise, it means that events were not processed correctly.
     */
    ASSERT(uv_run(uv_default_loop(), UV_RUN_NOWAIT) == 0);
  } else {
    /*
     * Close both ends of the pipe so that the child
     * get a POLLHUP event when it tries to read from
     * the other end.
     */
     close(fd[1]);
     close(fd[0]);

    waitpid(pid, &status, 0);
    ASSERT(WIFEXITED(status) && WEXITSTATUS(status) == 0);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}